

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.h
# Opt level: O2

uint16_t find_average_highbd(uint16_t *src,int h_start,int h_end,int v_start,int v_end,int stride)

{
  ulong uVar1;
  long lVar2;
  uint16_t *puVar3;
  int j;
  long lVar4;
  
  lVar2 = (long)v_start;
  puVar3 = src + stride * lVar2;
  uVar1 = 0;
  for (; lVar4 = (long)h_start, lVar2 < v_end; lVar2 = lVar2 + 1) {
    for (; lVar4 < h_end; lVar4 = lVar4 + 1) {
      uVar1 = uVar1 + puVar3[lVar4];
    }
    puVar3 = puVar3 + stride;
  }
  return (uint16_t)(uVar1 / (ulong)(long)((h_end - h_start) * (v_end - v_start)));
}

Assistant:

static inline uint16_t find_average_highbd(const uint16_t *src, int h_start,
                                           int h_end, int v_start, int v_end,
                                           int stride) {
  uint64_t sum = 0;
  for (int i = v_start; i < v_end; i++) {
    for (int j = h_start; j < h_end; j++) {
      sum += src[i * stride + j];
    }
  }
  uint64_t avg = sum / ((v_end - v_start) * (h_end - h_start));
  return (uint16_t)avg;
}